

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-math.h
# Opt level: O0

double mp::round_to_digits<double>(double value,int digits)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double factor;
  undefined8 local_8;
  
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    dVar1 = log10(ABS(in_XMM0_Qa));
    dVar1 = ceil(dVar1);
    dVar1 = pow(10.0,(double)in_EDI - dVar1);
    local_8 = round(in_XMM0_Qa * dVar1);
    local_8 = local_8 / dVar1;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

F round_to_digits(F value, int digits) {
    if (value == 0.0) // otherwise it will return 'nan'
        return 0.0;   // due to the log10() of zero

    F factor = std::pow(10.0,
                        digits
                        - std::ceil(std::log10(std::fabs(value))));
    return std::round(value * factor) / factor;
}